

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_strCompareIter_63(UCharIterator *iter1,UCharIterator *iter2,UBool codePointOrder)

{
  uint uVar1;
  uint local_2c;
  uint local_28;
  UChar32 c2;
  UChar32 c1;
  UBool codePointOrder_local;
  UCharIterator *iter2_local;
  UCharIterator *iter1_local;
  
  if (((iter1 != (UCharIterator *)0x0) && (iter2 != (UCharIterator *)0x0)) && (iter1 != iter2)) {
    (*iter1->move)(iter1,0,UITER_START);
    (*iter2->move)(iter2,0,UITER_START);
    do {
      local_28 = (*(code *)iter1->next)(iter1);
      local_2c = (*(code *)iter2->next)(iter2);
      if (local_28 != local_2c) {
        if ((((int)local_28 < 0xd800) || ((int)local_2c < 0xd800)) || (codePointOrder == '\0'))
        goto LAB_003de50d;
        if ((0xdbff < (int)local_28) ||
           (uVar1 = (*(code *)iter1->current)(iter1), (uVar1 & 0xfffffc00) != 0xdc00)) {
          if ((local_28 & 0xfffffc00) == 0xdc00) {
            (*(code *)iter1->previous)(iter1);
            uVar1 = (*(code *)iter1->previous)(iter1);
            if ((uVar1 & 0xfffffc00) == 0xd800) goto LAB_003de4a4;
          }
          local_28 = local_28 - 0x2800;
        }
LAB_003de4a4:
        if ((0xdbff < (int)local_2c) ||
           (uVar1 = (*(code *)iter2->current)(iter2), (uVar1 & 0xfffffc00) != 0xdc00)) {
          if ((local_2c & 0xfffffc00) == 0xdc00) {
            (*(code *)iter2->previous)(iter2);
            uVar1 = (*(code *)iter2->previous)(iter2);
            if ((uVar1 & 0xfffffc00) == 0xd800) goto LAB_003de50d;
          }
          local_2c = local_2c - 0x2800;
        }
LAB_003de50d:
        return local_28 - local_2c;
      }
    } while (local_28 != 0xffffffff);
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_strCompareIter(UCharIterator *iter1, UCharIterator *iter2, UBool codePointOrder) {
    UChar32 c1, c2;

    /* argument checking */
    if(iter1==NULL || iter2==NULL) {
        return 0; /* bad arguments */
    }
    if(iter1==iter2) {
        return 0; /* identical iterators */
    }

    /* reset iterators to start? */
    iter1->move(iter1, 0, UITER_START);
    iter2->move(iter2, 0, UITER_START);

    /* compare identical prefixes - they do not need to be fixed up */
    for(;;) {
        c1=iter1->next(iter1);
        c2=iter2->next(iter2);
        if(c1!=c2) {
            break;
        }
        if(c1==-1) {
            return 0;
        }
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && U16_IS_TRAIL(iter1->current(iter1))) ||
            (U16_IS_TRAIL(c1) && (iter1->previous(iter1), U16_IS_LEAD(iter1->previous(iter1))))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && U16_IS_TRAIL(iter2->current(iter2))) ||
            (U16_IS_TRAIL(c2) && (iter2->previous(iter2), U16_IS_LEAD(iter2->previous(iter2))))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}